

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::expectPrimitiveEq<capnp::Data::Reader>(Reader a,Reader b)

{
  int iVar1;
  Reader b_local;
  Reader a_local;
  DebugComparison<capnp::Data::Reader_&,_capnp::Data::Reader_&> _kjCondition;
  
  a_local.super_ArrayPtr<const_unsigned_char>.size_ = a.super_ArrayPtr<const_unsigned_char>.size_;
  a_local.super_ArrayPtr<const_unsigned_char>.ptr = a.super_ArrayPtr<const_unsigned_char>.ptr;
  b_local.super_ArrayPtr<const_unsigned_char>.size_ = b.super_ArrayPtr<const_unsigned_char>.size_;
  b_local.super_ArrayPtr<const_unsigned_char>.ptr = b.super_ArrayPtr<const_unsigned_char>.ptr;
  if (a_local.super_ArrayPtr<const_unsigned_char>.size_ ==
      b_local.super_ArrayPtr<const_unsigned_char>.size_) {
    if (a_local.super_ArrayPtr<const_unsigned_char>.size_ == 0) {
      _kjCondition.result = true;
    }
    else {
      iVar1 = bcmp(a_local.super_ArrayPtr<const_unsigned_char>.ptr,
                   b_local.super_ArrayPtr<const_unsigned_char>.ptr,
                   a_local.super_ArrayPtr<const_unsigned_char>.size_);
      _kjCondition.result = iVar1 == 0;
    }
  }
  else {
    _kjCondition.result = false;
  }
  _kjCondition.left = &a_local;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.right = &b_local;
    kj::_::Debug::
    log<char_const(&)[28],kj::_::DebugComparison<capnp::Data::Reader&,capnp::Data::Reader&>&,capnp::Data::Reader&,capnp::Data::Reader&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
               (char (*) [28])"failed: expected (a) == (b)",&_kjCondition,_kjCondition.left,&b_local
              );
  }
  return;
}

Assistant:

inline void expectPrimitiveEq(float a, float b) { EXPECT_FLOAT_EQ(a, b); }